

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void RecursiveTreeCompose
               (IceTInt *compose_group,IceTInt group_size,IceTInt group_rank,IceTInt image_dest,
               IceTSparseImage *imageData,IceTVoid *inSparseImageBuffer,IceTSparseImage *imageBuffer
               )

{
  IceTVoid *pIVar1;
  IceTEnum color_format;
  IceTEnum depth_format;
  IceTSizeType IVar2;
  IceTSizeType height;
  IceTSparseImage front_buffer;
  IceTSparseImage oldImage;
  IceTSizeType incoming_size;
  IceTSparseImage inSparseImage;
  void *pvStack_48;
  IceTSizeType package_size;
  IceTVoid *package_buffer;
  int local_38;
  IceTInt pair_proc;
  anon_enum_32 current_image;
  IceTInt middle;
  IceTVoid *inSparseImageBuffer_local;
  IceTSparseImage *imageData_local;
  int local_18;
  IceTInt image_dest_local;
  IceTInt group_rank_local;
  IceTInt group_size_local;
  IceTInt *compose_group_local;
  
  if (1 < group_size) {
    pair_proc = group_size / 2;
    _current_image = inSparseImageBuffer;
    inSparseImageBuffer_local = imageData;
    imageData_local._4_4_ = image_dest;
    local_18 = group_rank;
    image_dest_local = group_size;
    _group_rank_local = compose_group;
    if (group_rank < pair_proc) {
      RecursiveTreeCompose
                (compose_group,pair_proc,group_rank,image_dest,imageData,inSparseImageBuffer,
                 imageBuffer);
      if (local_18 == imageData_local._4_4_) {
        local_38 = 2;
        package_buffer._4_4_ = pair_proc;
      }
      else if ((local_18 == 0) &&
              ((imageData_local._4_4_ < 0 || (pair_proc <= imageData_local._4_4_)))) {
        if ((imageData_local._4_4_ < pair_proc) || (image_dest_local <= imageData_local._4_4_)) {
          local_38 = 2;
          package_buffer._4_4_ = pair_proc;
        }
        else {
          local_38 = 1;
          package_buffer._4_4_ = imageData_local._4_4_;
        }
      }
      else {
        local_38 = 0;
        package_buffer._4_4_ = -1;
      }
    }
    else {
      RecursiveTreeCompose
                (compose_group + pair_proc,group_size - pair_proc,group_rank - pair_proc,
                 image_dest - pair_proc,imageData,inSparseImageBuffer,imageBuffer);
      if (local_18 == imageData_local._4_4_) {
        local_38 = 2;
        package_buffer._4_4_ = 0;
      }
      else if ((local_18 == pair_proc) &&
              ((imageData_local._4_4_ < pair_proc || (image_dest_local <= imageData_local._4_4_))))
      {
        local_38 = 1;
        if ((imageData_local._4_4_ < 0) || (pair_proc <= imageData_local._4_4_)) {
          package_buffer._4_4_ = 0;
        }
        else {
          package_buffer._4_4_ = imageData_local._4_4_;
        }
      }
      else {
        local_38 = 0;
        package_buffer._4_4_ = -1;
      }
    }
    if (local_38 == 1) {
      icetSparseImagePackageForSend
                ((IceTSparseImage)*inSparseImageBuffer_local,&stack0xffffffffffffffb8,
                 (IceTSizeType *)((long)&inSparseImage.opaque_internals + 4));
      icetCommSend(pvStack_48,inSparseImage.opaque_internals._4_4_,0x8001,
                   _group_rank_local[package_buffer._4_4_],0x17);
    }
    else if (local_38 == 2) {
      color_format = icetSparseImageGetColorFormat((IceTSparseImage)*inSparseImageBuffer_local);
      depth_format = icetSparseImageGetDepthFormat((IceTSparseImage)*inSparseImageBuffer_local);
      IVar2 = icetSparseImageGetWidth((IceTSparseImage)*inSparseImageBuffer_local);
      height = icetSparseImageGetHeight((IceTSparseImage)*inSparseImageBuffer_local);
      IVar2 = icetSparseImageBufferSizeType(color_format,depth_format,IVar2,height);
      icetCommRecv(_current_image,IVar2,0x8001,_group_rank_local[package_buffer._4_4_],0x17);
      front_buffer = icetSparseImageUnpackageFromReceive(_current_image);
      if (local_18 < package_buffer._4_4_) {
        icetCompressedCompressedComposite
                  ((IceTSparseImage)*inSparseImageBuffer_local,front_buffer,
                   (IceTSparseImage)imageBuffer->opaque_internals);
      }
      else {
        icetCompressedCompressedComposite
                  (front_buffer,(IceTSparseImage)*inSparseImageBuffer_local,
                   (IceTSparseImage)imageBuffer->opaque_internals);
      }
      pIVar1 = *inSparseImageBuffer_local;
      *(IceTVoid **)inSparseImageBuffer_local = imageBuffer->opaque_internals;
      imageBuffer->opaque_internals = pIVar1;
    }
  }
  return;
}

Assistant:

static void RecursiveTreeCompose(const IceTInt *compose_group,
                                 IceTInt group_size,
                                 IceTInt group_rank,
                                 IceTInt image_dest,
                                 IceTSparseImage *imageData,
                                 IceTVoid *inSparseImageBuffer,
                                 IceTSparseImage *imageBuffer)
{
    IceTInt middle;
    enum { NO_IMAGE, SEND_IMAGE, RECV_IMAGE } current_image;
    IceTInt pair_proc;

    if (group_size <= 1) return;

  /* Build composite tree by splitting down middle. */
  /* If middle is in a group, then the image is sent there, otherwise the
   * image is sent to the processor of group_rank 0 (for that subgroup). */
    middle = group_size/2;
    if (group_rank < middle) {
        RecursiveTreeCompose(compose_group, middle, group_rank, image_dest,
                             imageData, inSparseImageBuffer, imageBuffer);
        if (group_rank == image_dest) {
          /* I'm the destination.  GIMME! */
            current_image = RECV_IMAGE;
            pair_proc = middle;
        } else if (   (group_rank == 0)
                   && ((image_dest < 0) || (image_dest >= middle)) ) {
          /* I have an image by default. */
            if ((image_dest >= middle) && (image_dest < group_size)) {
              /* Opposite subtree has destination.  Hand it over. */
                current_image = SEND_IMAGE;
                pair_proc = image_dest;
            } else {
              /* Opposite subtree does not have destination either.  Give
                 to me by default. */
                current_image = RECV_IMAGE;
                pair_proc = middle;
            }
        } else {
          /* I don't even have an image anymore. */
            current_image = NO_IMAGE;
            pair_proc = -1;
        }
    } else {
        RecursiveTreeCompose(compose_group + middle, group_size - middle,
                             group_rank - middle, image_dest - middle,
                             imageData, inSparseImageBuffer, imageBuffer);
        if (group_rank == image_dest) {
          /* I'm the destination.  GIMME! */
            current_image = RECV_IMAGE;
            pair_proc = 0;
        } else if (   (group_rank == middle)
                   && ((image_dest < middle) || (image_dest >= group_size)) ) {
          /* I have an image by default. */
            current_image = SEND_IMAGE;
            if ((image_dest >= 0) && (image_dest < middle)) {
                pair_proc = image_dest;
            } else {
                pair_proc = 0;
            }
        } else {
          /* I don't even have an image anymore. */
            current_image = NO_IMAGE;
            pair_proc = -1;
        }
    }

    if (current_image == SEND_IMAGE) {
      /* Hasta la vista, baby. */
        IceTVoid *package_buffer;
        IceTSizeType package_size;
        icetRaiseDebug1("Sending image to %d", (int)compose_group[pair_proc]);
        icetSparseImagePackageForSend(*imageData,
                                      &package_buffer,
                                      &package_size);
        icetCommSend(package_buffer, package_size, ICET_BYTE,
                     compose_group[pair_proc], TREE_IMAGE_DATA);
    } else if (current_image == RECV_IMAGE) {
      /* Get my image. */
        IceTSparseImage inSparseImage;
        IceTSizeType incoming_size;
        icetRaiseDebug1("Getting image from %d", (int)compose_group[pair_proc]);
        incoming_size = icetSparseImageBufferSizeType(
                                      icetSparseImageGetColorFormat(*imageData),
                                      icetSparseImageGetDepthFormat(*imageData),
                                      icetSparseImageGetWidth(*imageData),
                                      icetSparseImageGetHeight(*imageData));
        icetCommRecv(inSparseImageBuffer, incoming_size, ICET_BYTE,
                     compose_group[pair_proc], TREE_IMAGE_DATA);
        inSparseImage
            = icetSparseImageUnpackageFromReceive(inSparseImageBuffer);
        if (group_rank < pair_proc) {
            icetCompressedCompressedComposite(*imageData,
                                              inSparseImage,
                                              *imageBuffer);
        } else {
            icetCompressedCompressedComposite(inSparseImage,
                                              *imageData,
                                              *imageBuffer);
        }
        /* The actual image data is now in imageBuffer, so switch imageBuffer
           and imageData. */
        {
            IceTSparseImage oldImage = *imageData;
            *imageData = *imageBuffer;
            *imageBuffer = oldImage;
        }
    }
}